

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

int namingConventions::namingConventionsClasses
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  undefined8 this;
  bool bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  Pda *pPVar4;
  istream *piVar5;
  bool local_5d2;
  string local_570;
  string local_550;
  string local_530;
  Pda *local_510;
  string local_508;
  undefined1 local_4e8 [8];
  string name;
  string word;
  stringstream stream;
  string local_318 [7];
  bool found;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<Pda_*,_std::allocator<Pda_*>_> classPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newclassNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldclassNames;
  fstream buffer;
  allocator<char> local_79;
  string local_78;
  Pda *local_58;
  Pda *classChecker;
  Pda *classRecognizer;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string cl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputFiles_local;
  
  cl.field_2._8_8_ = inputFiles;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"class",&local_31);
  std::allocator<char>::~allocator(&local_31);
  classChecker = makeNamePda((string *)local_30);
  pPVar4 = (Pda *)operator_new(0x90);
  Pda::Pda(pPVar4);
  local_58 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"vbn/NamingConvTests/classChecker.json",&local_79);
  Pda::readJson(pPVar4,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::fstream::fstream
            (&oldclassNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&newclassNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<Pda_*,_std::allocator<Pda_*>_>::vector
            ((vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1);
  this = cl.field_2._8_8_;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)cl.field_2._8_8_);
  file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&file), bVar1) {
    line.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    _Var3 = std::__cxx11::string::c_str();
    std::operator|(_S_in,_S_out);
    std::fstream::open((char *)&oldclassNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var3);
    std::__cxx11::string::string(local_318);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)
                          &oldclassNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_318);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar1) break;
      bVar1 = false;
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)(word.field_2._M_local_buf + 8),local_318,_Var3);
      std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
      while( true ) {
        piVar5 = std::operator>>((istream *)(word.field_2._M_local_buf + 8),
                                 (string *)(name.field_2._M_local_buf + 8));
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        if (bVar1) {
          findClassName((string *)local_4e8,(string *)((long)&name.field_2 + 8));
          pPVar4 = local_58;
          std::__cxx11::string::string((string *)&local_508,(string *)local_4e8);
          bVar1 = Pda::traverse(pPVar4,&local_508);
          local_5d2 = false;
          if (!bVar1) {
            local_5d2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_4e8,"");
          }
          std::__cxx11::string::~string((string *)&local_508);
          if (local_5d2 != false) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&newclassNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (value_type *)local_4e8);
            local_510 = makeNamePda((string *)local_4e8);
            std::vector<Pda_*,_std::allocator<Pda_*>_>::push_back
                      ((vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1,&local_510);
            std::__cxx11::string::string((string *)&local_550,(string *)local_4e8);
            correctClassName(&local_530,&local_550);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_530);
            std::__cxx11::string::~string((string *)&local_530);
            std::__cxx11::string::~string((string *)&local_550);
          }
          bVar1 = false;
          std::__cxx11::string::~string((string *)local_4e8);
        }
        pPVar4 = classChecker;
        std::__cxx11::string::string((string *)&local_570,(string *)(name.field_2._M_local_buf + 8))
        ;
        bVar2 = Pda::traverse(pPVar4,&local_570);
        std::__cxx11::string::~string((string *)&local_570);
        if (bVar2) {
          bVar1 = true;
        }
      }
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      std::__cxx11::stringstream::~stringstream((stringstream *)(word.field_2._M_local_buf + 8));
    }
    std::fstream::close();
    std::__cxx11::string::~string(local_318);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  adjustForAllFiles((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)cl.field_2._8_8_,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&newclassNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1,true);
  std::vector<Pda_*,_std::allocator<Pda_*>_>::~vector
            ((vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&newclassNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::fstream::~fstream
            (&oldclassNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int namingConventions::namingConventionsClasses(const std::vector<std::string> &inputFiles) {
    std::string cl = "class";
    Pda *classRecognizer = makeNamePda(cl);
    Pda *classChecker = new Pda();
    classChecker->readJson("vbn/NamingConvTests/classChecker.json");
    std::fstream buffer;
    std::vector<std::string> oldclassNames;
    std::vector<std::string> newclassNames;
    std::vector<Pda *> classPdas;


// loop over files om alle classes te bepalen en een verbeterde versie hiervan op te slaan
    for (auto &file: inputFiles) {
        buffer.open(file.c_str());
        std::string line;
        while (std::getline(buffer, line)) {
            bool found = false;
            std::stringstream stream(line);
            std::string word;
            while (stream >> word) {
                if (found) {
                    std::string name = findClassName(word);
                    if (!classChecker->traverse(name) && name != "") {
                        oldclassNames.push_back(name);
                        classPdas.push_back(makeNamePda(name));
                        newclassNames.push_back(correctClassName(name));
                        found = false;

                    } else {
                        found = false;
                    }
                }
                if (classRecognizer->traverse(word)) {
                    found = true;
                }

            }

        }
        buffer.close();
    }
    adjustForAllFiles(inputFiles, oldclassNames, classPdas, true);
    return 0;

}